

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTDMT_initCStream_advanced
                 (ZSTDMT_CCtx *mtctx,void *dict,size_t dictSize,ZSTD_parameters params,
                 unsigned_long_long pledgedSrcSize)

{
  ZSTD_parameters ZVar1;
  size_t sVar2;
  long lVar3;
  ZSTD_CCtx_params *pZVar4;
  undefined8 *puVar5;
  byte bVar6;
  ZSTD_CCtx_params in_stack_fffffffffffffeb8;
  ZSTD_CCtx_params cctxParams;
  
  ZVar1 = params;
  bVar6 = 0;
  memcpy(&cctxParams,&mtctx->params,0x90);
  cctxParams.cParams.windowLog = params.cParams.windowLog;
  cctxParams.cParams.chainLog = params.cParams.chainLog;
  cctxParams.cParams.hashLog = ZVar1.cParams.hashLog;
  cctxParams.cParams.searchLog = ZVar1.cParams.searchLog;
  cctxParams.cParams.minMatch = ZVar1.cParams.minMatch;
  cctxParams.cParams.targetLength = params.cParams.targetLength;
  cctxParams.cParams.strategy = params.cParams.strategy;
  cctxParams.fParams.contentSizeFlag = params.fParams.contentSizeFlag;
  cctxParams.fParams.checksumFlag = params.fParams.checksumFlag;
  cctxParams.fParams.noDictIDFlag = params.fParams.noDictIDFlag;
  pZVar4 = &cctxParams;
  puVar5 = (undefined8 *)&stack0xfffffffffffffeb8;
  for (lVar3 = 0x12; lVar3 != 0; lVar3 = lVar3 + -1) {
    *puVar5 = *(undefined8 *)pZVar4;
    pZVar4 = (ZSTD_CCtx_params *)((long)pZVar4 + (ulong)bVar6 * -0x10 + 8);
    puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
  }
  sVar2 = ZSTDMT_initCStream_internal
                    (mtctx,dict,dictSize,ZSTD_dct_auto,(ZSTD_CDict *)0x0,in_stack_fffffffffffffeb8,
                     pledgedSrcSize);
  return sVar2;
}

Assistant:

size_t ZSTDMT_initCStream_advanced(ZSTDMT_CCtx* mtctx,
                             const void* dict, size_t dictSize,
                                   ZSTD_parameters params,
                                   unsigned long long pledgedSrcSize)
{
    ZSTD_CCtx_params cctxParams = mtctx->params;  /* retrieve sticky params */
    DEBUGLOG(4, "ZSTDMT_initCStream_advanced (pledgedSrcSize=%u)", (U32)pledgedSrcSize);
    cctxParams.cParams = params.cParams;
    cctxParams.fParams = params.fParams;
    return ZSTDMT_initCStream_internal(mtctx, dict, dictSize, ZSTD_dct_auto, NULL,
                                       cctxParams, pledgedSrcSize);
}